

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperOffset::~ClipperOffset(ClipperOffset *this)

{
  ClipperOffset *this_local;
  
  Clear(this);
  PolyNode::~PolyNode(&this->m_polyNodes);
  std::vector<ClipperLib::DoublePoint,_std::allocator<ClipperLib::DoublePoint>_>::~vector
            (&this->m_normals);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            (&this->m_destPoly);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            (&this->m_srcPoly);
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::~vector(&this->m_destPolys);
  return;
}

Assistant:

ClipperOffset::~ClipperOffset()
{
  Clear();
}